

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall duckdb::HashJoinRepartitionEvent::FinishEvent(HashJoinRepartitionEvent *this)

{
  HashJoinGlobalSinkState *pHVar1;
  ClientContext *context;
  PhysicalHashJoin *pPVar2;
  pointer pJVar3;
  idx_t iVar4;
  pointer pTVar5;
  idx_t iVar6;
  type pipeline;
  size_type __n;
  allocator_type local_51;
  value_type_conflict1 local_50;
  vector<unsigned_long,_true> partition_counts;
  vector<unsigned_long,_true> partition_sizes;
  
  ::std::
  vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  ::clear(&this->local_hts->
           super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
         );
  pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->sink->hash_table);
  __n = 1L << ((byte)pJVar3->radix_bits & 0x3f);
  partition_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_sizes,__n,
             (value_type_conflict1 *)&partition_counts,(allocator_type *)&local_50);
  local_50 = 0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_counts,__n,
             &local_50,&local_51);
  pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->sink->hash_table);
  iVar4 = JoinHashTable::GetTotalSize
                    (pJVar3,&partition_sizes,&partition_counts,&this->sink->max_partition_size,
                     &this->sink->max_partition_count);
  pHVar1 = this->sink;
  pHVar1->total_size = iVar4;
  context = pHVar1->context;
  pPVar2 = this->op;
  pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&pHVar1->hash_table);
  iVar4 = GetPartitioningSpaceRequirement
                    (context,&(pPVar2->super_PhysicalComparisonJoin).super_PhysicalJoin.
                              super_CachingPhysicalOperator.super_PhysicalOperator.types,
                     pJVar3->radix_bits,this->sink->num_threads);
  pHVar1 = this->sink;
  pHVar1->probe_side_requirement = iVar4;
  pTVar5 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(&pHVar1->temporary_memory_state);
  iVar4 = this->sink->max_partition_size;
  pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->sink->hash_table);
  iVar6 = JoinHashTable::PointerTableSize(pJVar3,this->sink->max_partition_count);
  TemporaryMemoryState::SetMinimumReservation
            (pTVar5,iVar6 + iVar4 + this->sink->probe_side_requirement);
  pTVar5 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(&this->sink->temporary_memory_state);
  TemporaryMemoryState::UpdateReservation
            (pTVar5,((this->super_BasePipelineEvent).super_Event.executor)->context);
  pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->sink->hash_table);
  pTVar5 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(&this->sink->temporary_memory_state);
  iVar4 = TemporaryMemoryState::GetReservation(pTVar5);
  JoinHashTable::PrepareExternalFinalize(pJVar3,iVar4 - this->sink->probe_side_requirement);
  pHVar1 = this->sink;
  pipeline = shared_ptr<duckdb::Pipeline,_true>::operator*
                       (&(this->super_BasePipelineEvent).pipeline);
  HashJoinGlobalSinkState::ScheduleFinalize(pHVar1,pipeline,(Event *)this);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_counts);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_sizes);
  return;
}

Assistant:

void FinishEvent() override {
		local_hts.clear();

		// Minimum reservation is now the new smallest partition size
		const auto num_partitions = RadixPartitioning::NumberOfPartitions(sink.hash_table->GetRadixBits());
		vector<idx_t> partition_sizes(num_partitions, 0);
		vector<idx_t> partition_counts(num_partitions, 0);
		sink.total_size = sink.hash_table->GetTotalSize(partition_sizes, partition_counts, sink.max_partition_size,
		                                                sink.max_partition_count);
		sink.probe_side_requirement =
		    GetPartitioningSpaceRequirement(sink.context, op.types, sink.hash_table->GetRadixBits(), sink.num_threads);

		sink.temporary_memory_state->SetMinimumReservation(sink.max_partition_size +
		                                                   sink.hash_table->PointerTableSize(sink.max_partition_count) +
		                                                   sink.probe_side_requirement);
		sink.temporary_memory_state->UpdateReservation(executor.context);

		D_ASSERT(sink.temporary_memory_state->GetReservation() >= sink.probe_side_requirement);
		sink.hash_table->PrepareExternalFinalize(sink.temporary_memory_state->GetReservation() -
		                                         sink.probe_side_requirement);
		sink.ScheduleFinalize(*pipeline, *this);
	}